

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

void __thiscall
Args::HelpPrinter::sortArg
          (HelpPrinter *this,ArgPtr *arg,
          vector<Args::Command_*,_std::allocator<Args::Command_*>_> *commands,
          vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *required,
          vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *optional,size_type *maxFlag,
          size_type *maxName,size_type *maxCommand,bool requiredAllOfGroup)

{
  int iVar1;
  uint uVar2;
  pointer pAVar3;
  pointer pAVar4;
  long lVar5;
  ulong uVar6;
  ulong *in_stack_00000010;
  byte in_stack_00000018;
  type f;
  size_type length;
  Command *cmd;
  GroupIface *g;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *in_stack_fffffffffffffd98;
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  *this_00;
  vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *in_stack_fffffffffffffda0;
  value_type *in_stack_fffffffffffffda8;
  _Bind<void_(Args::HelpPrinter::*(const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
  *__f;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> *in_stack_fffffffffffffdb0;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __last;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  __first;
  reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
  *in_stack_fffffffffffffdc8;
  reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
  *in_stack_fffffffffffffdd0;
  _Placeholder<1> *in_stack_fffffffffffffdd8;
  long lVar7;
  HelpPrinter **in_stack_fffffffffffffde0;
  offset_in_HelpPrinter_to_subr *in_stack_fffffffffffffde8;
  ArgIface *in_stack_fffffffffffffdf0;
  GroupIface *local_200;
  reference_wrapper<unsigned_long> *in_stack_fffffffffffffe18;
  reference_wrapper<unsigned_long> *in_stack_fffffffffffffe20;
  reference_wrapper<unsigned_long> *in_stack_fffffffffffffe28;
  bool *in_stack_fffffffffffffe30;
  undefined1 local_188 [80];
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_138;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *local_130;
  unsigned_long *local_128;
  undefined1 local_120 [16];
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  local_110;
  code *local_f0;
  _Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  local_e8;
  undefined1 local_e0 [96];
  string local_80 [40];
  pointer local_58;
  GroupIface *local_50;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_41 [3];
  
  local_41[0]._M_t.super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>.
  _M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
  super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
  super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
       (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)(in_stack_00000018 & 1);
  pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::get
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      in_stack_fffffffffffffda0);
  if (pAVar3 == (pointer)0x0) {
    local_200 = (GroupIface *)0x0;
  }
  else {
    local_200 = (GroupIface *)__dynamic_cast(pAVar3,&ArgIface::typeinfo,&GroupIface::typeinfo,0);
  }
  local_50 = local_200;
  pAVar4 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                     ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                      0x140b65);
  iVar1 = (*pAVar4->_vptr_ArgIface[2])();
  if (iVar1 == 0) {
    local_58 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::get
                         ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                          in_stack_fffffffffffffda0);
    std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::push_back
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    (*local_58->_vptr_ArgIface[3])();
    lVar5 = std::__cxx11::string::length();
    uVar2 = (*local_58->_vptr_ArgIface[4])();
    if ((uVar2 & 1) == 0) {
      lVar7 = 0;
    }
    else {
      (*local_58->_vptr_ArgIface[9])();
      lVar7 = std::__cxx11::string::length();
      lVar7 = lVar7 + 3;
    }
    uVar6 = lVar5 + lVar7;
    std::__cxx11::string::~string(local_80);
    if (*in_stack_00000010 < uVar6) {
      *in_stack_00000010 = uVar6;
    }
  }
  else if (local_50 == (GroupIface *)0x0) {
    pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                        0x140e93);
    uVar2 = (*pAVar3->_vptr_ArgIface[5])();
    if (((uVar2 & 1) == 0) &&
       (((byte)local_41[0]._M_t.
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.
               m_delete & 1) == 0)) {
      std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::get
                ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                 in_stack_fffffffffffffda0);
      std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::push_back
                (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    }
    else {
      std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::get
                ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                 in_stack_fffffffffffffda0);
      std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>::push_back
                (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    }
    std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::get
              ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
               in_stack_fffffffffffffda0);
    calcMaxFlagAndName(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                       (size_type *)in_stack_fffffffffffffde0);
  }
  else {
    uVar6 = (**(code **)(*(long *)local_50 + 0x28))();
    if (((uVar6 & 1) == 0) || (iVar1 = (**(code **)(*(long *)local_50 + 0x10))(), iVar1 != 4)) {
      local_41[0]._M_t.
      super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
      super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
      super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
      super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
           (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)
           (Deleter<Args::ArgIface>)0x0;
    }
    else {
      local_41[0]._M_t.
      super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
      super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
      super__Tuple_impl<1UL,_Args::details::Deleter<Args::ArgIface>_>.
      super__Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>._M_head_impl.m_delete =
           (_Head_base<1UL,_Args::details::Deleter<Args::ArgIface>,_false>)
           (Deleter<Args::ArgIface>)0x1;
    }
    local_f0 = sortArg;
    local_e8._M_head_impl._M_data =
         (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
         (vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *)0x0;
    local_110.
    super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::ref<std::vector<Args::Command*,std::allocator<Args::Command*>>>
                            ((vector<Args::Command_*,_std::allocator<Args::Command_*>_> *)
                             in_stack_fffffffffffffd98);
    local_110.
    super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)std::ref<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>
                            (in_stack_fffffffffffffd98);
    local_110.
    super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::ref<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>
                            (in_stack_fffffffffffffd98);
    local_120._8_8_ = std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffffd98);
    local_120._0_8_ = std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffffd98);
    local_128 = (unsigned_long *)std::ref<unsigned_long>((unsigned_long *)in_stack_fffffffffffffd98)
    ;
    this_00 = &local_110;
    __f = (_Bind<void_(Args::HelpPrinter::*(const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
           *)local_120;
    __last._M_current =
         (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)&local_128;
    __first._M_current = local_41;
    std::
    bind<void(Args::HelpPrinter::*)(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const,Args::HelpPrinter_const*,std::_Placeholder<1>const&,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool&>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>
                *)pAVar3,in_stack_fffffffffffffe18,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe28,in_stack_fffffffffffffe30);
    GroupIface::children(local_50);
    local_130 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                std::
                vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                ::cbegin(this_00);
    GroupIface::children(local_50);
    local_138 = (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                std::
                vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
                ::cend(this_00);
    memcpy(local_188,local_e0,0x50);
    std::
    for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter_const*,std::_Placeholder<1>,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool))(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const>>
              (__first,__last,__f);
  }
  return;
}

Assistant:

inline void
HelpPrinter::sortArg( const ArgPtr & arg,
	std::vector< Command* > & commands,
	std::vector< ArgIface* > & required,
	std::vector< ArgIface* > & optional,
	String::size_type & maxFlag,
	String::size_type & maxName,
	String::size_type & maxCommand,
	bool requiredAllOfGroup ) const
{
	GroupIface * g = dynamic_cast< GroupIface* > ( arg.get() );

	if( arg->type() == ArgType::Command )
	{
		Command * cmd = static_cast< Command* > ( arg.get() );

		commands.push_back( cmd );

		String::size_type length = cmd->name().length() + ( cmd->isWithValue() ?
			3 + cmd->valueSpecifier().length() : 0 );

		if( length > maxCommand )
			maxCommand = length;
	}
	else if( g )
	{
		if( g->isRequired() && g->type() == ArgType::AllOfGroup )
			requiredAllOfGroup = true;
		else
			requiredAllOfGroup = false;

		auto f = std::bind( &HelpPrinter::sortArg, this, std::placeholders::_1,
			std::ref( commands ), std::ref( required ),
			std::ref( optional ), std::ref( maxFlag ),
			std::ref( maxName ), std::ref( maxCommand ),
			requiredAllOfGroup );

		std::for_each( g->children().cbegin(),
			g->children().cend(), f );
	}
	else
	{
		if( arg->isRequired() || requiredAllOfGroup )
			required.push_back( arg.get() );
		else
			optional.push_back( arg.get() );

		calcMaxFlagAndName( arg.get(), maxFlag, maxName );
	}
}